

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_join.cpp
# Opt level: O1

void duckdb::PhysicalJoin::BuildJoinPipelines
               (Pipeline *current,MetaPipeline *meta_pipeline,PhysicalOperator *op,bool build_rhs)

{
  _Head_base<0UL,_duckdb::GlobalOperatorState_*,_false> _Var1;
  _Head_base<0UL,_duckdb::GlobalSinkState_*,_false> _Var2;
  PhysicalOperator *this;
  bool bVar3;
  int iVar4;
  PipelineBuildState *this_00;
  reference this_01;
  type last_pipeline;
  MetaPipeline *this_02;
  reference pvVar5;
  ClientContext *context;
  optional_ptr<duckdb::MetaPipeline,_true> last_child_ptr;
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> dependencies;
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> pipelines_so_far;
  optional_ptr<duckdb::MetaPipeline,_true> local_70;
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  local_68;
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  local_48;
  
  _Var1._M_head_impl =
       (op->op_state).
       super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
       .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl;
  (op->op_state).
  super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
  .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl =
       (GlobalOperatorState *)0x0;
  if (_Var1._M_head_impl != (GlobalOperatorState *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_GlobalOperatorState[1])();
  }
  _Var2._M_head_impl =
       (op->sink_state).
       super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>
       .super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl;
  (op->sink_state).
  super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>.
  super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl = (GlobalSinkState *)0x0;
  if (_Var2._M_head_impl != (GlobalSinkState *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_GlobalSinkState + 8))();
  }
  this_00 = MetaPipeline::GetState(meta_pipeline);
  PipelineBuildState::AddPipelineOperator(this_00,current,op);
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MetaPipeline::GetPipelines
            (meta_pipeline,(vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> *)&local_48,
             false);
  this_01 = vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true>::back
                      ((vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> *)&local_48);
  last_pipeline = shared_ptr<duckdb::Pipeline,_true>::operator*(this_01);
  local_68.
  super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70.ptr = (MetaPipeline *)0x0;
  if (build_rhs) {
    this_02 = MetaPipeline::CreateChildMetaPipeline(meta_pipeline,current,op,JOIN_BUILD);
    pvVar5 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                       (&op->children,1);
    MetaPipeline::Build(this_02,pvVar5->_M_data);
    pvVar5 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                       (&op->children,1);
    this = pvVar5->_M_data;
    context = Pipeline::GetClientContext(current);
    bVar3 = PhysicalOperator::CanSaturateThreads(this,context);
    if (bVar3) {
      MetaPipeline::GetPipelines
                (this_02,(vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> *)&local_68,false
                );
      local_70.ptr = MetaPipeline::GetLastChild(meta_pipeline);
    }
  }
  pvVar5 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                     (&op->children,0);
  (*pvVar5->_M_data->_vptr_PhysicalOperator[0x26])(pvVar5->_M_data,current,meta_pipeline);
  if (local_70.ptr != (MetaPipeline *)0x0) {
    optional_ptr<duckdb::MetaPipeline,_true>::CheckValid(&local_70);
    MetaPipeline::AddRecursiveDependencies
              (meta_pipeline,(vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> *)&local_68,
               local_70.ptr);
  }
  if (op->type != CROSS_PRODUCT) {
    if (op->type != POSITIONAL_JOIN) {
      iVar4 = (*op->_vptr_PhysicalOperator[0x13])(op);
      if ((char)iVar4 == '\0') goto LAB_00bd42fb;
    }
    MetaPipeline::CreateChildPipeline(meta_pipeline,current,op,last_pipeline);
  }
LAB_00bd42fb:
  ::std::
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  ::~vector(&local_68);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void PhysicalJoin::BuildJoinPipelines(Pipeline &current, MetaPipeline &meta_pipeline, PhysicalOperator &op,
                                      bool build_rhs) {
	op.op_state.reset();
	op.sink_state.reset();

	// 'current' is the probe pipeline: add this operator
	auto &state = meta_pipeline.GetState();
	state.AddPipelineOperator(current, op);

	// save the last added pipeline to set up dependencies later (in case we need to add a child pipeline)
	vector<shared_ptr<Pipeline>> pipelines_so_far;
	meta_pipeline.GetPipelines(pipelines_so_far, false);
	auto &last_pipeline = *pipelines_so_far.back();

	vector<shared_ptr<Pipeline>> dependencies;
	optional_ptr<MetaPipeline> last_child_ptr;
	if (build_rhs) {
		// on the RHS (build side), we construct a child MetaPipeline with this operator as its sink
		auto &child_meta_pipeline = meta_pipeline.CreateChildMetaPipeline(current, op, MetaPipelineType::JOIN_BUILD);
		child_meta_pipeline.Build(op.children[1]);
		if (op.children[1].get().CanSaturateThreads(current.GetClientContext())) {
			// if the build side can saturate all available threads,
			// we don't just make the LHS pipeline depend on the RHS, but recursively all LHS children too.
			// this prevents breadth-first plan evaluation
			child_meta_pipeline.GetPipelines(dependencies, false);
			last_child_ptr = meta_pipeline.GetLastChild();
		}
	}

	// continue building the current pipeline on the LHS (probe side)
	op.children[0].get().BuildPipelines(current, meta_pipeline);

	if (last_child_ptr) {
		// the pointer was set, set up the dependencies
		meta_pipeline.AddRecursiveDependencies(dependencies, *last_child_ptr);
	}

	switch (op.type) {
	case PhysicalOperatorType::POSITIONAL_JOIN:
		// Positional joins are always outer
		meta_pipeline.CreateChildPipeline(current, op, last_pipeline);
		return;
	case PhysicalOperatorType::CROSS_PRODUCT:
		return;
	default:
		break;
	}

	// Join can become a source operator if it's RIGHT/OUTER, or if the hash join goes out-of-core
	if (op.Cast<PhysicalJoin>().IsSource()) {
		meta_pipeline.CreateChildPipeline(current, op, last_pipeline);
	}
}